

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                 *this,void **vtt,int64_t globalsize)

{
  void *in_RDX;
  TPZFrontNonSym<std::complex<long_double>_> *in_RSI;
  void **in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  void **GlobalSize;
  TPZAbstractFrontMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZAbstractFrontMatrix<std::complex<long_double>_>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffd0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = (in_RSI->super_TPZFront<std::complex<long_double>_>).super_TPZSavable._vptr_TPZSavable;
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage
            ((TPZStackEqnStorage<std::complex<long_double>_> *)(in_RDI + 4));
  GlobalSize = in_RDI + 0xb482;
  TPZFrontNonSym<std::complex<long_double>_>::TPZFrontNonSym(in_RSI);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0xb4a9));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0xb4ad));
  TPZFrontNonSym<std::complex<long_double>_>::Reset(in_RSI,(int64_t)GlobalSize);
  TPZStackEqnStorage<std::complex<long_double>_>::Reset
            ((TPZStackEqnStorage<std::complex<long_double>_> *)0x1d041f5);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0xb4a8] = (void *)0xffffffffffffffff;
  in_RDI[0xb4a7] = in_RDX;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix(int64_t globalsize) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>(globalsize,globalsize)
{
	fFront.Reset(globalsize);
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=globalsize;
}